

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::ComputeVersionedName
          (cmGeneratorTarget *this,string *vName,string *prefix,string *base,string *suffix,
          string *name,cmValue version)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  bool bVar4;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string *local_38;
  
  pcVar2 = this->Makefile;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_38 = suffix;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"APPLE","");
  bVar4 = cmMakefile::IsOn(pcVar2,&local_78);
  if (bVar4) {
    std::operator+(&local_58,prefix,base);
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    pcVar3 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar3,pcVar3 + name->_M_string_length);
  }
  std::__cxx11::string::_M_assign((string *)vName);
  paVar1 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (version.Value != (string *)0x0) {
    std::__cxx11::string::append((char *)vName);
    std::__cxx11::string::_M_append((char *)vName,(ulong)((version.Value)->_M_dataplus)._M_p);
  }
  pcVar2 = this->Makefile;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"APPLE","");
  bVar4 = cmMakefile::IsOn(pcVar2,&local_78);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  if (bVar4) {
    pcVar3 = (local_38->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar3,pcVar3 + local_38->_M_string_length);
  }
  else {
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
  }
  std::__cxx11::string::_M_append((char *)vName,(ulong)local_58._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGeneratorTarget::ComputeVersionedName(
  std::string& vName, std::string const& prefix, std::string const& base,
  std::string const& suffix, std::string const& name, cmValue version) const
{
  vName = this->Makefile->IsOn("APPLE") ? (prefix + base) : name;
  if (version) {
    vName += ".";
    vName += *version;
  }
  vName += this->Makefile->IsOn("APPLE") ? suffix : std::string();
}